

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O2

bool __thiscall VanEmdeBoasTree::find(VanEmdeBoasTree *this,Node *root,int value)

{
  Node **ppNVar1;
  Node *pNVar2;
  int iVar3;
  
  while( true ) {
    if (root == (Node *)0x0) {
      return false;
    }
    if (value < 0) {
      return false;
    }
    if (((root->uni <= value) || (value < root->min)) || (root->max < value)) {
      return false;
    }
    if (root->min == value) {
      return true;
    }
    if (root->summary == (Node *)0x0) break;
    ppNVar1 = root->cluster;
    iVar3 = high(this,root,value);
    pNVar2 = ppNVar1[iVar3];
    value = low(this,root,value);
    root = pNVar2;
  }
  return root->max == value;
}

Assistant:

bool VanEmdeBoasTree::find(Node *root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }
    if (root->min == value) {
        return true;
    }
    if (!root->summary) {
        return root->max == value;
    }
    return find(root->cluster[high(root, value)], low(root, value));
}